

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_3::DepthRangeEvaluator::evaluate
          (DepthRangeEvaluator *this,ShaderEvalContext *c)

{
  VecAccess<float,_4,_3> local_48;
  Vector<float,_3> local_30;
  float local_24;
  float local_20;
  float diff;
  float zFar;
  float zNear;
  ShaderEvalContext *c_local;
  DepthRangeEvaluator *this_local;
  
  _zFar = c;
  c_local = (ShaderEvalContext *)this;
  diff = deFloatClamp(this->m_params->zNear,0.0,1.0);
  local_20 = deFloatClamp(this->m_params->zFar,0.0,1.0);
  local_24 = local_20 - diff;
  tcu::Vector<float,_3>::Vector(&local_30,diff,local_20,local_24 * 0.5 + 0.5);
  tcu::Vector<float,_4>::xyz(&local_48,&_zFar->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_48,&local_30);
  return;
}

Assistant:

void evaluate (gls::ShaderEvalContext& c)
	{
		float zNear	= deFloatClamp(m_params.zNear, 0.0f, 1.0f);
		float zFar	= deFloatClamp(m_params.zFar, 0.0f, 1.0f);
		float diff	= zFar - zNear;
		c.color.xyz() = tcu::Vec3(zNear, zFar, diff*0.5f + 0.5f);
	}